

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O0

void __thiscall cmCTestLaunchReporter::WriteXML(cmCTestLaunchReporter *this)

{
  bool bVar1;
  char *str;
  char *local_370;
  cmXMLElement local_368;
  cmXMLElement e2;
  cmXMLWriter xml;
  undefined1 local_2f8 [8];
  cmGeneratedFileStream fxml;
  cmAlphaNum local_60;
  undefined1 local_30 [8];
  string logXML;
  cmCTestLaunchReporter *this_local;
  
  logXML.field_2._8_8_ = this;
  cmAlphaNum::cmAlphaNum(&local_60,&this->LogDir);
  bVar1 = IsError(this);
  str = "warning-";
  if (bVar1) {
    str = "error-";
  }
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fxml.field_0x260,str);
  cmStrCat<std::__cxx11::string,char[5]>
            ((string *)local_30,&local_60,(cmAlphaNum *)&fxml.field_0x260,&this->LogHash,
             (char (*) [5])0xd14c2f);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2f8,(string *)local_30,false,None);
  cmXMLWriter::cmXMLWriter((cmXMLWriter *)&e2,(ostream *)local_2f8,2);
  cmXMLElement::cmXMLElement(&local_368,(cmXMLWriter *)&e2,"Failure");
  bVar1 = IsError(this);
  local_370 = "Warning";
  if (bVar1) {
    local_370 = "Error";
  }
  cmXMLElement::Attribute<char_const*>(&local_368,"type",&local_370);
  WriteXMLAction(this,&local_368);
  WriteXMLCommand(this,&local_368);
  WriteXMLResult(this,&local_368);
  WriteXMLLabels(this,&local_368);
  cmXMLElement::~cmXMLElement(&local_368);
  cmXMLWriter::~cmXMLWriter((cmXMLWriter *)&e2);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2f8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmCTestLaunchReporter::WriteXML()
{
  // Name the xml file.
  std::string logXML =
    cmStrCat(this->LogDir, this->IsError() ? "error-" : "warning-",
             this->LogHash, ".xml");

  // Use cmGeneratedFileStream to atomically create the report file.
  cmGeneratedFileStream fxml(logXML);
  cmXMLWriter xml(fxml, 2);
  cmXMLElement e2(xml, "Failure");
  e2.Attribute("type", this->IsError() ? "Error" : "Warning");
  this->WriteXMLAction(e2);
  this->WriteXMLCommand(e2);
  this->WriteXMLResult(e2);
  this->WriteXMLLabels(e2);
}